

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O3

int __thiscall Fl_Function_Type::open(Fl_Function_Type *this,char *__file,int __oflag,...)

{
  char cVar1;
  Fl_Menu_Item *pFVar2;
  char cVar3;
  int iVar4;
  Fl_Button *pFVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  Fl_Double_Window *c;
  Fl_Choice **ppFVar9;
  Fl_Function_Type *pFVar10;
  Fl_Choice **ppFVar11;
  _func_int **pp_Var12;
  bool bVar13;
  _func_int **local_40;
  Fl_Group *local_38;
  
  if (function_panel == (Fl_Double_Window *)0x0) {
    make_function_panel();
  }
  local_38 = (Fl_Group *)&this->return_type;
  Fl_Input_::static_value(&f_return_type_input->super_Fl_Input_,this->return_type);
  Fl_Input_::static_value(&f_name_input->super_Fl_Input_,(this->super_Fl_Type).name_);
  pFVar10 = this;
  do {
    pFVar10 = (Fl_Function_Type *)(pFVar10->super_Fl_Type).parent;
    if (pFVar10 == (Fl_Function_Type *)0x0) {
      ppFVar9 = &f_public_choice;
      Fl_Choice::value(f_public_choice,(uint)('\0' < this->public_));
      ppFVar11 = &f_public_member_choice;
      goto LAB_00178cc5;
    }
    iVar4 = (*(pFVar10->super_Fl_Type)._vptr_Fl_Type[0x26])(pFVar10);
  } while (iVar4 == 0);
  ppFVar9 = &f_public_member_choice;
  Fl_Choice::value(f_public_member_choice,(int)this->public_);
  ppFVar11 = &f_public_choice;
LAB_00178cc5:
  (*((*ppFVar9)->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget[5])();
  (*((*ppFVar11)->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget[6])();
  Fl_Button::value(&f_c_button->super_Fl_Button,(int)this->cdecl_);
  pcVar6 = (this->super_Fl_Type).comment_;
  pcVar7 = "";
  if (pcVar6 != (char *)0x0) {
    pcVar7 = pcVar6;
  }
  Fl_Text_Buffer::text((f_comment_input->super_Fl_Text_Display).mBuffer,pcVar7);
  c = function_panel;
  (*(function_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[5])();
  pcVar6 = (char *)0x0;
LAB_00178d2f:
  do {
    do {
      if (pcVar6 != (char *)0x0) {
        c = (Fl_Double_Window *)0x21908d;
        fl_alert("%s");
      }
      while( true ) {
        pFVar5 = (Fl_Button *)Fl::readqueue();
        if (pFVar5 == f_panel_cancel) goto LAB_00178f83;
        if (pFVar5 == &f_panel_ok->super_Fl_Button) break;
        if (pFVar5 == (Fl_Button *)0x0) {
          Fl::wait(c);
        }
      }
      pcVar7 = (f_name_input->super_Fl_Input_).value_;
      pp_Var12 = (_func_int **)(pcVar7 + -1);
      do {
        pcVar7 = pcVar7 + 1;
        pcVar6 = (char *)((long)pp_Var12 + 1);
        pp_Var12 = (_func_int **)((long)pp_Var12 + 1);
        iVar4 = isspace((int)*pcVar6);
      } while (iVar4 != 0);
      c = (Fl_Double_Window *)&stack0xffffffffffffffc0;
      local_40 = pp_Var12;
      pcVar6 = _c_check((char **)c,0);
    } while (pcVar6 != (char *)0x0);
    cVar3 = *(char *)pp_Var12;
    cVar1 = cVar3;
    while (cVar1 != '(') {
      c = (Fl_Double_Window *)(ulong)(uint)(int)cVar1;
      iVar4 = isspace((int)cVar1);
      if ((cVar1 == '\0') || (iVar4 != 0)) {
        pcVar6 = "must be name(arguments), try again:";
        if (cVar3 != '\0') goto LAB_00178d2f;
        break;
      }
      cVar1 = *pcVar7;
      pcVar7 = pcVar7 + 1;
    }
    pp_Var12 = (_func_int **)(f_return_type_input->super_Fl_Input_).value_;
    c = (Fl_Double_Window *)&stack0xffffffffffffffc0;
    local_40 = pp_Var12;
    pcVar6 = _c_check((char **)c,0);
  } while (pcVar6 != (char *)0x0);
  Fl_Type::name(&this->super_Fl_Type,(f_name_input->super_Fl_Input_).value_);
  storestring((char *)pp_Var12,(char **)local_38,0);
  pFVar10 = this;
  do {
    pFVar10 = (Fl_Function_Type *)(pFVar10->super_Fl_Type).parent;
    if (pFVar10 == (Fl_Function_Type *)0x0) {
      cVar3 = this->public_;
      pFVar2 = (f_public_choice->super_Fl_Menu_).value_;
      if (pFVar2 == (Fl_Menu_Item *)0x0) goto LAB_00178ec6;
      lVar8 = ((long)pFVar2 - (long)(f_public_choice->super_Fl_Menu_).menu_ >> 3) *
              0x6db6db6db6db6db7;
      bVar13 = (int)lVar8 == (int)cVar3;
      goto LAB_00178eca;
    }
    iVar4 = (*(pFVar10->super_Fl_Type)._vptr_Fl_Type[0x26])(pFVar10);
  } while (iVar4 == 0);
  cVar3 = this->public_;
  pFVar2 = (f_public_member_choice->super_Fl_Menu_).value_;
  if (pFVar2 == (Fl_Menu_Item *)0x0) {
LAB_00178ec6:
    lVar8 = 0xff;
    bVar13 = cVar3 == -1;
LAB_00178eca:
    if (!bVar13) goto LAB_00178ede;
    bVar13 = false;
  }
  else {
    lVar8 = ((long)pFVar2 - (long)(f_public_member_choice->super_Fl_Menu_).menu_ >> 3) *
            0x6db6db6db6db6db7;
    if ((int)lVar8 == (int)cVar3) {
      bVar13 = false;
    }
    else {
LAB_00178ede:
      this->public_ = (char)lVar8;
      redraw_browser();
      bVar13 = true;
    }
  }
  cVar3 = (f_c_button->super_Fl_Button).value_;
  if (this->cdecl_ != cVar3) {
    this->cdecl_ = cVar3;
    bVar13 = true;
  }
  pcVar6 = Fl_Text_Buffer::text((f_comment_input->super_Fl_Text_Display).mBuffer);
  if ((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) {
    if ((this->super_Fl_Type).comment_ != (char *)0x0) {
      redraw_browser();
    }
    Fl_Type::comment(&this->super_Fl_Type,(char *)0x0);
    if (pcVar6 == (char *)0x0) goto LAB_00178f75;
  }
  else {
    pcVar7 = (this->super_Fl_Type).comment_;
    if ((pcVar7 == (char *)0x0) || (iVar4 = strcmp(pcVar6,pcVar7), iVar4 != 0)) {
      redraw_browser();
    }
    Fl_Type::comment(&this->super_Fl_Type,pcVar6);
  }
  free(pcVar6);
LAB_00178f75:
  if (bVar13) {
    set_modflag(1);
  }
LAB_00178f83:
  iVar4 = (*(function_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[6])();
  return iVar4;
}

Assistant:

void Fl_Function_Type::open() {
  if (!function_panel) make_function_panel();
  f_return_type_input->static_value(return_type);
  f_name_input->static_value(name());
  if (is_in_class()) {
    f_public_member_choice->value(public_);
    f_public_member_choice->show();
    f_public_choice->hide();
  } else {
    f_public_choice->value(public_>0);
    f_public_choice->show();
    f_public_member_choice->hide();
  }
  f_c_button->value(cdecl_);
  const char *c = comment();
  f_comment_input->buffer()->text(c?c:"");
  function_panel->show();
  const char* message = 0;
  for (;;) { // repeat as long as there are errors
    if (message) fl_alert("%s", message);
    for (;;) {
      Fl_Widget* w = Fl::readqueue();
      if (w == f_panel_cancel) goto BREAK2;
      else if (w == f_panel_ok) break;
      else if (!w) Fl::wait();
    }
    const char*c = f_name_input->value();
    while (isspace(*c)) c++;
    message = c_check(c); if (message) continue;
    const char *d = c;
    for (; *d != '('; d++) if (isspace(*d) || !*d) break;
    if (*c && *d != '(') {
      message = "must be name(arguments), try again:"; continue;
    }
    int mod = 0;
    c = f_return_type_input->value();
    message = c_check(c); if (message) continue;
    name(f_name_input->value());
    storestring(c, return_type);
    if (is_in_class()) {
      if (public_ != f_public_member_choice->value()) {
        mod = 1;
        public_ = f_public_member_choice->value();
        redraw_browser();
      }
    } else {
      if (public_ != f_public_choice->value()) {
        mod = 1;
        public_ = f_public_choice->value();
        redraw_browser();
      }
    }
    if (cdecl_ != f_c_button->value()) {
      mod = 1;
      cdecl_ = f_c_button->value();
    }
    c = f_comment_input->buffer()->text();
    if (c && *c) {
      if (!comment() || strcmp(c, comment())) redraw_browser();
      comment(c);
    } else {
      if (comment()) redraw_browser();
      comment(0);
    }
    if (c) free((void*)c);
    if (mod) set_modflag(1);
    break;
  }
BREAK2:
  function_panel->hide();
}